

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O3

void __thiscall
trimesh::mscomplex_t::set_critpt
          (mscomplex_t *this,int i,cellid_t c,char idx,fn_t f,cellid_t v,bool b)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->m_cp_cellid).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[i] = c;
  (this->m_cp_vertid).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[i] = v;
  (this->m_cp_index).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start[i] = idx;
  (this->m_cp_fn).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[i] = f;
  (this->m_cp_is_boundry).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[i] = b;
  uVar1 = -(ulong)(f < this->m_fmax);
  uVar2 = -(ulong)(this->m_fmin < f);
  this->m_fmax = (fn_t)(~uVar1 & (ulong)f | (ulong)this->m_fmax & uVar1);
  this->m_fmin = (fn_t)(~uVar2 & (ulong)f | (ulong)this->m_fmin & uVar2);
  return;
}

Assistant:

void mscomplex_t::set_critpt
(int i, cellid_t c, char idx, fn_t f, cellid_t v, bool b)
{
  m_cp_cellid[i]     = c;
  m_cp_vertid[i]     = v;
  m_cp_index[i]      = idx;
  m_cp_fn[i]         = f;
  m_cp_is_boundry[i] = b;

  m_fmax = std::max(f,m_fmax);
  m_fmin = std::min(f,m_fmin);
}